

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SyntaxList<slang::syntax::LocalVariableDeclarationSyntax>,slang::syntax::SyntaxList<slang::syntax::LocalVariableDeclarationSyntax>const&>
          (BumpAllocator *this,SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *args)

{
  SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *pSVar1;
  SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pSVar1 = (SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *)
           allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::SyntaxList<slang::syntax::LocalVariableDeclarationSyntax>::SyntaxList
            (in_RSI,pSVar1);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }